

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O1

cmGlobalGenerator * __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalWatcomWMakeGenerator>::CreateGlobalGenerator
          (cmGlobalGeneratorSimpleFactory<cmGlobalWatcomWMakeGenerator> *this,string *name,cmake *cm
          )

{
  int iVar1;
  cmGlobalGenerator *this_00;
  undefined8 local_20;
  undefined4 local_18;
  undefined1 local_14;
  
  local_20 = 0x57206d6f63746157;
  local_18 = 0x656b614d;
  local_14 = 0;
  if ((name->_M_string_length == 0xc) &&
     (iVar1 = bcmp((name->_M_dataplus)._M_p,&local_20,0xc), iVar1 == 0)) {
    this_00 = (cmGlobalGenerator *)operator_new(0x6d8);
    cmGlobalWatcomWMakeGenerator::cmGlobalWatcomWMakeGenerator
              ((cmGlobalWatcomWMakeGenerator *)this_00,cm);
    return this_00;
  }
  return (cmGlobalGenerator *)0x0;
}

Assistant:

cmGlobalGenerator* CreateGlobalGenerator(const std::string& name,
                                           cmake* cm) const override
  {
    if (name != T::GetActualName()) {
      return nullptr;
    }
    return new T(cm);
  }